

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_deserialize_field
          (t_ocaml_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  string *psVar1;
  ostream *poVar2;
  string local_70;
  undefined1 local_50 [8];
  string name;
  t_type *type;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  name.field_2._8_8_ = t_field::get_type(tfield);
  psVar1 = t_field::get_name_abi_cxx11_(tfield);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar1);
  t_generator::decapitalize((string *)local_50,(t_generator *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"#set_");
  poVar2 = std::operator<<(poVar2,(string *)local_50);
  std::operator<<(poVar2," ");
  generate_deserialize_type(this,out,(t_type *)name.field_2._8_8_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void t_ocaml_generator::generate_deserialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = tfield->get_type();

  string name = decapitalize(tfield->get_name());
  indent(out) << prefix << "#set_" << name << " ";
  generate_deserialize_type(out, type);
  out << endl;
}